

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::flattened_access_chain_struct_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t base,uint32_t *indices,
          uint32_t count,SPIRType *target_type,uint32_t offset)

{
  uint32_t uVar1;
  size_t sVar2;
  TypedID *this_00;
  SPIRType *target_type_00;
  char *local_168;
  string local_128 [32];
  string local_108 [32];
  undefined1 local_e8 [8];
  string tmp;
  Bitset decorations;
  bool local_7e;
  bool local_7d;
  uint32_t matrix_stride;
  bool relaxed;
  bool need_transpose;
  uint32_t member_offset;
  SPIRType *member_type;
  uint32_t i;
  string local_60;
  undefined1 local_39;
  SPIRType *local_38;
  SPIRType *target_type_local;
  uint32_t *puStack_28;
  uint32_t count_local;
  uint32_t *indices_local;
  CompilerGLSL *pCStack_18;
  uint32_t base_local;
  CompilerGLSL *this_local;
  string *expr;
  
  local_39 = 0;
  local_38 = target_type;
  target_type_local._4_4_ = count;
  puStack_28 = indices;
  indices_local._4_4_ = base;
  pCStack_18 = this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (((this->backend).can_declare_struct_inline & 1U) == 0) {
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"{");
  }
  else {
    type_to_glsl_constructor_abi_cxx11_(&local_60,this,local_38);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
    ::std::__cxx11::string::~string((string *)&local_60);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(");
  }
  for (member_type._0_4_ = 0;
      sVar2 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                        (&(local_38->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>),
      (uint)member_type < (uint)sVar2; member_type._0_4_ = (uint)member_type + 1) {
    if ((uint)member_type != 0) {
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    }
    this_00 = (TypedID *)
              VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                        (&(local_38->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                         (ulong)(uint)member_type);
    uVar1 = TypedID::operator_cast_to_unsigned_int(this_00);
    target_type_00 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar1);
    uVar1 = Compiler::type_struct_member_offset(&this->super_Compiler,local_38,(uint)member_type);
    local_7d = false;
    local_7e = false;
    decorations.higher._M_h._M_single_bucket._4_4_ = 0;
    if (1 < target_type_00->columns) {
      Compiler::combined_decoration_for_member
                ((Bitset *)((long)&tmp.field_2 + 8),&this->super_Compiler,local_38,(uint)member_type
                );
      local_7d = Bitset::get((Bitset *)((long)&tmp.field_2 + 8),4);
      local_7e = Bitset::get((Bitset *)((long)&tmp.field_2 + 8),0);
      decorations.higher._M_h._M_single_bucket._4_4_ =
           Compiler::type_struct_member_matrix_stride
                     (&this->super_Compiler,local_38,(uint)member_type);
      Bitset::~Bitset((Bitset *)((long)&tmp.field_2 + 8));
    }
    flattened_access_chain_abi_cxx11_
              ((string *)local_e8,this,indices_local._4_4_,puStack_28,target_type_local._4_4_,
               target_type_00,offset + uVar1,decorations.higher._M_h._M_single_bucket._4_4_,0,
               local_7d);
    if (local_7d == false) {
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_e8);
    }
    else {
      ::std::__cxx11::string::string(local_128,(string *)local_e8);
      (*(this->super_Compiler)._vptr_Compiler[0x2a])
                (local_108,this,local_128,target_type_00,0,0,local_7e);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_108);
      ::std::__cxx11::string::~string(local_108);
      ::std::__cxx11::string::~string(local_128);
    }
    ::std::__cxx11::string::~string((string *)local_e8);
  }
  if (((this->backend).can_declare_struct_inline & 1U) == 0) {
    local_168 = "}";
  }
  else {
    local_168 = ")";
  }
  ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_168);
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerGLSL::flattened_access_chain_struct(uint32_t base, const uint32_t *indices, uint32_t count,
                                                        const SPIRType &target_type, uint32_t offset)
{
	std::string expr;

	if (backend.can_declare_struct_inline)
	{
		expr += type_to_glsl_constructor(target_type);
		expr += "(";
	}
	else
		expr += "{";

	for (uint32_t i = 0; i < uint32_t(target_type.member_types.size()); ++i)
	{
		if (i != 0)
			expr += ", ";

		const SPIRType &member_type = get<SPIRType>(target_type.member_types[i]);
		uint32_t member_offset = type_struct_member_offset(target_type, i);

		// The access chain terminates at the struct, so we need to find matrix strides and row-major information
		// ahead of time.
		bool need_transpose = false;
		bool relaxed = false;
		uint32_t matrix_stride = 0;
		if (member_type.columns > 1)
		{
			auto decorations = combined_decoration_for_member(target_type, i);
			need_transpose = decorations.get(DecorationRowMajor);
			relaxed = decorations.get(DecorationRelaxedPrecision);
			matrix_stride = type_struct_member_matrix_stride(target_type, i);
		}

		auto tmp = flattened_access_chain(base, indices, count, member_type, offset + member_offset, matrix_stride,
		                                  0 /* array_stride */, need_transpose);

		// Cannot forward transpositions, so resolve them here.
		if (need_transpose)
			expr += convert_row_major_matrix(tmp, member_type, 0, false, relaxed);
		else
			expr += tmp;
	}

	expr += backend.can_declare_struct_inline ? ")" : "}";

	return expr;
}